

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char string_buffer_pop_back(string_buffer_t *sb)

{
  size_t sVar1;
  char back;
  string_buffer_t *sb_local;
  
  if (sb != (string_buffer_t *)0x0) {
    if (sb->size == 0) {
      sb_local._7_1_ = '\0';
    }
    else {
      sVar1 = sb->size;
      sb->size = sVar1 - 1;
      sb_local._7_1_ = sb->s[sVar1 - 1];
      sb->s[sb->size] = '\0';
    }
    return sb_local._7_1_;
  }
  __assert_fail("sb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x161,"char string_buffer_pop_back(string_buffer_t *)");
}

Assistant:

char string_buffer_pop_back(string_buffer_t *sb) {
    assert(sb != NULL);
    if (sb->size == 0)
        return 0;

    char back = sb->s[--sb->size];
    sb->s[sb->size] = 0;
    return back;
}